

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

string * __thiscall
google::protobuf::Reflection::GetRepeatedStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,int index,string *scratch)

{
  byte bVar1;
  Descriptor *pDVar2;
  CppStringType CVar3;
  uint32_t uVar4;
  RepeatedField<absl::lts_20250127::Cord> *this_00;
  const_reference src;
  string *psVar5;
  RepeatedPtrFieldBase *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar6;
  char *description;
  Metadata MVar7;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
LAB_0041a2e5:
    pDVar2 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar2,MVar7.descriptor,field,"GetRepeatedStringReference");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ == pDVar2) {
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      GetRepeatedStringReference();
      goto LAB_0041a2e5;
    }
    if ((bVar1 & 0x20) != 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (pDVar2,field,"GetRepeatedStringReference",CPPTYPE_STRING);
      }
      if ((bVar1 & 8) == 0) {
        CVar3 = FieldDescriptor::cpp_string_type(field);
        if ((CVar3 != kView) && (CVar3 != kString)) {
          if (CVar3 == kCord) {
            this_00 = GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                                (this,message,field);
            src = RepeatedField<absl::lts_20250127::Cord>::Get(this_00,index);
            absl::lts_20250127::CopyCordToString(src,scratch);
            return scratch;
          }
          GetRepeatedStringReference();
        }
        this_01 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                             (this,message,field)->super_RepeatedPtrFieldBase;
        pVVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                           (this_01,index);
        return pVVar6;
      }
      uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      psVar5 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                         ((ExtensionSet *)
                          ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                          field->number_,index);
      return psVar5;
    }
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"GetRepeatedStringReference",description);
}

Assistant:

const std::string& Reflection::GetRepeatedStringReference(
    const Message& message, const FieldDescriptor* field, int index,
    std::string* scratch) const {
  (void)scratch;  // Parameter is used by Google-internal code.
  USAGE_CHECK_ALL(GetRepeatedStringReference, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        absl::CopyCordToString(
            GetRepeatedField<absl::Cord>(message, field, index), scratch);
        return *scratch;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
    internal::Unreachable();
  }
}